

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  Rep *pRVar1;
  size_type sVar2;
  int iVar3;
  int n;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  void **ppvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar11 = (long)(this->field_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->field_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar11 != 0) {
    lVar12 = lVar11 * 8;
    lVar10 = 0;
    do {
      sVar5 = FieldDescriptorProto::ByteSizeLong(*(FieldDescriptorProto **)((long)ppvVar9 + lVar10))
      ;
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar12 - lVar10 != 0);
  }
  lVar12 = (long)(this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar12;
  pRVar1 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      sVar5 = ByteSizeLong(*(DescriptorProto **)((long)ppvVar9 + lVar10));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  lVar12 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar12;
  pRVar1 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      sVar5 = EnumDescriptorProto::ByteSizeLong(*(EnumDescriptorProto **)((long)ppvVar9 + lVar10));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  lVar12 = (long)(this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar12;
  pRVar1 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      sVar5 = DescriptorProto_ExtensionRange::ByteSizeLong
                        (*(DescriptorProto_ExtensionRange **)((long)ppvVar9 + lVar10));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  lVar12 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar12;
  pRVar1 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      sVar5 = FieldDescriptorProto::ByteSizeLong(*(FieldDescriptorProto **)((long)ppvVar9 + lVar10))
      ;
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  lVar12 = (long)(this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar12;
  pRVar1 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      sVar5 = OneofDescriptorProto::ByteSizeLong(*(OneofDescriptorProto **)((long)ppvVar9 + lVar10))
      ;
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  lVar12 = (long)(this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar12;
  pRVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar10 = 0;
    do {
      sVar5 = DescriptorProto_ReservedRange::ByteSizeLong
                        (*(DescriptorProto_ReservedRange **)((long)ppvVar9 + lVar10));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar11 = lVar11 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar12 * 8 != lVar10);
  }
  uVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = lVar11 + (ulong)uVar4;
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      lVar11 = *(long *)((long)((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements
                               [uVar7] + 8);
      uVar8 = (uint)lVar11 | 1;
      iVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + lVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 3) != 0) {
    if ((uVar4 & 1) != 0) {
      sVar2 = ((this->name_).ptr_)->_M_string_length;
      uVar8 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      sVar6 = MessageOptions::ByteSizeLong(this->options_);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar5;
    return sVar5;
  }
  sVar5 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar5,&this->_cached_size_);
  return sVar5;
}

Assistant:

size_t DescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  total_size += 1UL * this->_internal_field_size();
  for (const auto& msg : this->field_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  total_size += 1UL * this->_internal_nested_type_size();
  for (const auto& msg : this->nested_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  total_size += 1UL * this->_internal_enum_type_size();
  for (const auto& msg : this->enum_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  total_size += 1UL * this->_internal_extension_range_size();
  for (const auto& msg : this->extension_range_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  total_size += 1UL * this->_internal_extension_size();
  for (const auto& msg : this->extension_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  total_size += 1UL * this->_internal_oneof_decl_size();
  for (const auto& msg : this->oneof_decl_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  total_size += 1UL * this->_internal_reserved_range_size();
  for (const auto& msg : this->reserved_range_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string reserved_name = 10;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(reserved_name_.size());
  for (int i = 0, n = reserved_name_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      reserved_name_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}